

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O3

int ARKodeRootInit(void *arkode_mem,int nrtfn,ARKRootFn g)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  void *__ptr;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  int error_code;
  char *msgfmt;
  long lVar8;
  long lVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar15 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar2 = 0x31;
    goto LAB_0015b97d;
  }
  uVar1 = 0;
  if (0 < nrtfn) {
    if (*(long *)((long)arkode_mem + 0x98) == 0) {
      msgfmt = 
      "Time-stepping module missing fullrhs routine (required by requested solver configuration).";
      iVar15 = -0x16;
      error_code = -0x16;
      iVar2 = 0x3d;
      goto LAB_0015b97d;
    }
    iVar2 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x250),
                        (N_Vector *)((long)arkode_mem + 600));
    uVar1 = nrtfn;
    if (iVar2 == 0) {
      msgfmt = "A memory request failed.";
      iVar15 = -0x14;
      error_code = -0x14;
      iVar2 = 0x44;
      goto LAB_0015b97d;
    }
  }
  plVar4 = *(long **)((long)arkode_mem + 0x3d8);
  if (plVar4 == (long *)0x0) {
    plVar4 = (long *)malloc(0x88);
    *(long **)((long)arkode_mem + 0x3d8) = plVar4;
    if (plVar4 == (long *)0x0) {
      arkProcessError((ARKodeMem)arkode_mem,0,0x50,"ARKodeRootInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                      ,"Allocation of arkode_mem failed.");
      return -0x14;
    }
    uVar3 = 0;
    *plVar4 = 0;
    *(undefined4 *)(plVar4 + 1) = 0;
    *(undefined4 *)((long)plVar4 + 100) = 0;
    plVar4[0xe] = 0;
    plVar4[2] = 0;
    plVar4[3] = 0;
    plVar4[7] = 0;
    plVar4[8] = 0;
    plVar4[9] = 0;
    *(undefined4 *)(plVar4 + 0xf) = 1;
    plVar4[0x10] = *(long *)((long)arkode_mem + 0x10);
    lVar8 = *(long *)((long)arkode_mem + 0x368) + 5;
    lVar10 = *(long *)((long)arkode_mem + 0x370) + 0xc;
LAB_0015b3e9:
    *(long *)((long)arkode_mem + 0x368) = lVar8;
    *(long *)((long)arkode_mem + 0x370) = lVar10;
  }
  else {
    uVar3 = *(uint *)(plVar4 + 1);
    if (0 < (int)uVar3 && uVar1 != uVar3) {
      free((void *)plVar4[7]);
      lVar8 = *(long *)((long)arkode_mem + 0x3d8);
      *(undefined8 *)(lVar8 + 0x38) = 0;
      free(*(void **)(lVar8 + 0x40));
      lVar8 = *(long *)((long)arkode_mem + 0x3d8);
      *(undefined8 *)(lVar8 + 0x40) = 0;
      free(*(void **)(lVar8 + 0x48));
      lVar8 = *(long *)((long)arkode_mem + 0x3d8);
      *(undefined8 *)(lVar8 + 0x48) = 0;
      free(*(void **)(lVar8 + 0x10));
      lVar8 = *(long *)((long)arkode_mem + 0x3d8);
      *(undefined8 *)(lVar8 + 0x10) = 0;
      free(*(void **)(lVar8 + 0x18));
      lVar8 = *(long *)((long)arkode_mem + 0x3d8);
      *(undefined8 *)(lVar8 + 0x18) = 0;
      free(*(void **)(lVar8 + 0x70));
      plVar4 = *(long **)((long)arkode_mem + 0x3d8);
      plVar4[0xe] = 0;
      uVar3 = *(uint *)(plVar4 + 1);
      lVar8 = (long)(int)uVar3 * 3;
      auVar11._8_4_ = (int)lVar8;
      auVar11._0_8_ = lVar8;
      auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = *(long *)((long)arkode_mem + 0x368) + (long)(int)uVar3 * -3;
      lVar10 = *(long *)((long)arkode_mem + 0x370) - auVar11._8_8_;
      goto LAB_0015b3e9;
    }
  }
  if (nrtfn < 1) {
    *(undefined4 *)(plVar4 + 1) = 0;
    *plVar4 = 0;
    return 0;
  }
  if (uVar1 == uVar3) {
    if ((ARKRootFn)*plVar4 == g) {
      return 0;
    }
    if (g != (ARKRootFn)0x0) {
      *plVar4 = (long)g;
      return 0;
    }
    free((void *)plVar4[7]);
    lVar8 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar8 + 0x38) = 0;
    free(*(void **)(lVar8 + 0x40));
    lVar8 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar8 + 0x40) = 0;
    free(*(void **)(lVar8 + 0x48));
    lVar8 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar8 + 0x48) = 0;
    free(*(void **)(lVar8 + 0x10));
    lVar8 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar8 + 0x10) = 0;
    free(*(void **)(lVar8 + 0x18));
    lVar8 = *(long *)((long)arkode_mem + 0x3d8);
    *(undefined8 *)(lVar8 + 0x18) = 0;
    free(*(void **)(lVar8 + 0x70));
    *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x70) = 0;
    *(ulong *)((long)arkode_mem + 0x368) = *(long *)((long)arkode_mem + 0x368) - (ulong)(uVar1 * 3);
    *(ulong *)((long)arkode_mem + 0x370) = *(long *)((long)arkode_mem + 0x370) - (ulong)(uVar1 * 3);
    msgfmt = "g = NULL illegal.";
    iVar15 = -0x16;
    error_code = -0x16;
    iVar2 = 0x9e;
  }
  else {
    *(uint *)(plVar4 + 1) = uVar1;
    if (g == (ARKRootFn)0x0) {
      msgfmt = "g = NULL illegal.";
      iVar15 = -0x16;
      error_code = -0x16;
      iVar2 = 0xaf;
    }
    else {
      *plVar4 = (long)g;
      sVar7 = (ulong)uVar1 * 8;
      __ptr = malloc(sVar7);
      plVar4[7] = (long)__ptr;
      if (__ptr == (void *)0x0) {
        msgfmt = "A memory request failed.";
        iVar15 = -0x14;
        error_code = -0x14;
        iVar2 = 0xba;
      }
      else {
        pvVar5 = malloc(sVar7);
        plVar4[8] = (long)pvVar5;
        if (pvVar5 == (void *)0x0) {
          free(__ptr);
          plVar4[7] = 0;
          msgfmt = "A memory request failed.";
          iVar15 = -0x14;
          error_code = -0x14;
          iVar2 = 0xc4;
        }
        else {
          pvVar5 = malloc(sVar7);
          plVar4[9] = (long)pvVar5;
          if (pvVar5 == (void *)0x0) {
            free(__ptr);
            plVar4[7] = 0;
            free((void *)plVar4[8]);
            *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x40) = 0;
            msgfmt = "A memory request failed.";
            iVar15 = -0x14;
            error_code = -0x14;
            iVar2 = 0xd0;
          }
          else {
            sVar7 = (ulong)uVar1 << 2;
            pvVar5 = malloc(sVar7);
            plVar4[2] = (long)pvVar5;
            if (pvVar5 == (void *)0x0) {
              free(__ptr);
              plVar4[7] = 0;
              free((void *)plVar4[8]);
              lVar8 = *(long *)((long)arkode_mem + 0x3d8);
              *(undefined8 *)(lVar8 + 0x40) = 0;
              free(*(void **)(lVar8 + 0x48));
              *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x48) = 0;
              msgfmt = "A memory request failed.";
              iVar15 = -0x14;
              error_code = -0x14;
              iVar2 = 0xde;
            }
            else {
              pvVar5 = malloc(sVar7);
              plVar4[3] = (long)pvVar5;
              if (pvVar5 == (void *)0x0) {
                free(__ptr);
                plVar4[7] = 0;
                free((void *)plVar4[8]);
                lVar8 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar8 + 0x40) = 0;
                free(*(void **)(lVar8 + 0x48));
                lVar8 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar8 + 0x48) = 0;
                free(*(void **)(lVar8 + 0x10));
                *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x10) = 0;
                msgfmt = "A memory request failed.";
                iVar15 = -0x14;
                error_code = -0x14;
                iVar2 = 0xee;
              }
              else {
                pvVar6 = malloc(sVar7);
                plVar4[0xe] = (long)pvVar6;
                if (pvVar6 != (void *)0x0) {
                  lVar10 = 0;
                  memset(pvVar5,0,(ulong)(uint)nrtfn * 4);
                  auVar11 = _DAT_00181580;
                  lVar8 = (ulong)(uint)nrtfn - 1;
                  auVar9._8_4_ = (int)lVar8;
                  auVar9._0_8_ = lVar8;
                  auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
                  auVar9 = auVar9 ^ _DAT_00181580;
                  auVar12 = _DAT_00181560;
                  auVar13 = _DAT_00181570;
                  do {
                    auVar14 = auVar13 ^ auVar11;
                    iVar2 = auVar9._4_4_;
                    if ((bool)(~(auVar14._4_4_ == iVar2 && auVar9._0_4_ < auVar14._0_4_ ||
                                iVar2 < auVar14._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar6 + lVar10) = 1;
                    }
                    if ((auVar14._12_4_ != auVar9._12_4_ || auVar14._8_4_ <= auVar9._8_4_) &&
                        auVar14._12_4_ <= auVar9._12_4_) {
                      *(undefined4 *)((long)pvVar6 + lVar10 + 4) = 1;
                    }
                    auVar14 = auVar12 ^ auVar11;
                    iVar15 = auVar14._4_4_;
                    if (iVar15 <= iVar2 && (iVar15 != iVar2 || auVar14._0_4_ <= auVar9._0_4_)) {
                      *(undefined4 *)((long)pvVar6 + lVar10 + 8) = 1;
                      *(undefined4 *)((long)pvVar6 + lVar10 + 0xc) = 1;
                    }
                    lVar8 = auVar13._8_8_;
                    auVar13._0_8_ = auVar13._0_8_ + 4;
                    auVar13._8_8_ = lVar8 + 4;
                    lVar8 = auVar12._8_8_;
                    auVar12._0_8_ = auVar12._0_8_ + 4;
                    auVar12._8_8_ = lVar8 + 4;
                    lVar10 = lVar10 + 0x10;
                  } while ((ulong)(nrtfn + 3U >> 2) << 4 != lVar10);
                  *(ulong *)((long)arkode_mem + 0x368) =
                       (ulong)(uVar1 * 3) + *(long *)((long)arkode_mem + 0x368);
                  *(ulong *)((long)arkode_mem + 0x370) =
                       (ulong)(uVar1 * 3) + *(long *)((long)arkode_mem + 0x370);
                  return 0;
                }
                free(__ptr);
                plVar4[7] = 0;
                free((void *)plVar4[8]);
                lVar8 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar8 + 0x40) = 0;
                free(*(void **)(lVar8 + 0x48));
                lVar8 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar8 + 0x48) = 0;
                free(*(void **)(lVar8 + 0x10));
                lVar8 = *(long *)((long)arkode_mem + 0x3d8);
                *(undefined8 *)(lVar8 + 0x10) = 0;
                free(*(void **)(lVar8 + 0x18));
                *(undefined8 *)(*(long *)((long)arkode_mem + 0x3d8) + 0x18) = 0;
                msgfmt = "A memory request failed.";
                iVar15 = -0x14;
                error_code = -0x14;
                iVar2 = 0x101;
              }
            }
          }
        }
      }
    }
  }
LAB_0015b97d:
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar2,"ARKodeRootInit",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                  ,msgfmt);
  return iVar15;
}

Assistant:

int ARKodeRootInit(void* arkode_mem, int nrtfn, ARKRootFn g)
{
  int i, nrt;

  /* unpack ark_mem */
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  nrt     = (nrtfn < 0) ? 0 : nrtfn;

  /* Ensure that stepper provides fullrhs function */
  if (nrt > 0)
  {
    if (!(ark_mem->step_fullrhs))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_MISSING_FULLRHS);
      return ARK_ILL_INPUT;
    }

    if (!arkAllocVec(ark_mem, ark_mem->yn, &ark_mem->fn))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_MEM_FAIL);
      return (ARK_MEM_FAIL);
    }
  }

  /* If unallocated, allocate rootfinding structure, set defaults, update space */
  if (ark_mem->root_mem == NULL)
  {
    ark_mem->root_mem = (ARKodeRootMem)malloc(sizeof(struct ARKodeRootMemRec));
    if (ark_mem->root_mem == NULL)
    {
      arkProcessError(ark_mem, 0, __LINE__, __func__, __FILE__,
                      MSG_ARK_ARKMEM_FAIL);
      return (ARK_MEM_FAIL);
    }
    ark_mem->root_mem->glo       = NULL;
    ark_mem->root_mem->ghi       = NULL;
    ark_mem->root_mem->grout     = NULL;
    ark_mem->root_mem->iroots    = NULL;
    ark_mem->root_mem->rootdir   = NULL;
    ark_mem->root_mem->gfun      = NULL;
    ark_mem->root_mem->nrtfn     = 0;
    ark_mem->root_mem->irfnd     = 0;
    ark_mem->root_mem->gactive   = NULL;
    ark_mem->root_mem->mxgnull   = 1;
    ark_mem->root_mem->root_data = ark_mem->user_data;

    ark_mem->lrw += ARK_ROOT_LRW;
    ark_mem->liw += ARK_ROOT_LIW;
  }

  /* If rerunning ARKodeRootInit() with a different number of root
     functions (changing number of gfun components), then free
     currently held memory resources */
  if ((nrt != ark_mem->root_mem->nrtfn) && (ark_mem->root_mem->nrtfn > 0))
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots);
    ark_mem->root_mem->iroots = NULL;
    free(ark_mem->root_mem->rootdir);
    ark_mem->root_mem->rootdir = NULL;
    free(ark_mem->root_mem->gactive);
    ark_mem->root_mem->gactive = NULL;

    ark_mem->lrw -= 3 * (ark_mem->root_mem->nrtfn);
    ark_mem->liw -= 3 * (ark_mem->root_mem->nrtfn);
  }

  /* If ARKodeRootInit() was called with nrtfn == 0, then set
     nrtfn to zero and gfun to NULL before returning */
  if (nrt == 0)
  {
    ark_mem->root_mem->nrtfn = nrt;
    ark_mem->root_mem->gfun  = NULL;
    return (ARK_SUCCESS);
  }

  /* If rerunning ARKodeRootInit() with the same number of root
     functions (not changing number of gfun components), then
     check if the root function argument has changed */
  /* If g != NULL then return as currently reserved memory
     resources will suffice */
  if (nrt == ark_mem->root_mem->nrtfn)
  {
    if (g != ark_mem->root_mem->gfun)
    {
      if (g == NULL)
      {
        free(ark_mem->root_mem->glo);
        ark_mem->root_mem->glo = NULL;
        free(ark_mem->root_mem->ghi);
        ark_mem->root_mem->ghi = NULL;
        free(ark_mem->root_mem->grout);
        ark_mem->root_mem->grout = NULL;
        free(ark_mem->root_mem->iroots);
        ark_mem->root_mem->iroots = NULL;
        free(ark_mem->root_mem->rootdir);
        ark_mem->root_mem->rootdir = NULL;
        free(ark_mem->root_mem->gactive);
        ark_mem->root_mem->gactive = NULL;

        ark_mem->lrw -= 3 * nrt;
        ark_mem->liw -= 3 * nrt;

        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_ARK_NULL_G);
        return (ARK_ILL_INPUT);
      }
      else
      {
        ark_mem->root_mem->gfun = g;
        return (ARK_SUCCESS);
      }
    }
    else { return (ARK_SUCCESS); }
  }

  /* Set variable values in ARKODE memory block */
  ark_mem->root_mem->nrtfn = nrt;
  if (g == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_G);
    return (ARK_ILL_INPUT);
  }
  else { ark_mem->root_mem->gfun = g; }

  /* Allocate necessary memory and return */
  ark_mem->root_mem->glo = NULL;
  ark_mem->root_mem->glo = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (ark_mem->root_mem->glo == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->ghi = NULL;
  ark_mem->root_mem->ghi = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (ark_mem->root_mem->ghi == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->grout = NULL;
  ark_mem->root_mem->grout = (sunrealtype*)malloc(nrt * sizeof(sunrealtype));
  if (ark_mem->root_mem->grout == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->iroots = NULL;
  ark_mem->root_mem->iroots = (int*)malloc(nrt * sizeof(int));
  if (ark_mem->root_mem->iroots == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->rootdir = NULL;
  ark_mem->root_mem->rootdir = (int*)malloc(nrt * sizeof(int));
  if (ark_mem->root_mem->rootdir == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots);
    ark_mem->root_mem->iroots = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }
  ark_mem->root_mem->gactive = NULL;
  ark_mem->root_mem->gactive =
    (sunbooleantype*)malloc(nrt * sizeof(sunbooleantype));
  if (ark_mem->root_mem->gactive == NULL)
  {
    free(ark_mem->root_mem->glo);
    ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi);
    ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout);
    ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots);
    ark_mem->root_mem->iroots = NULL;
    free(ark_mem->root_mem->rootdir);
    ark_mem->root_mem->rootdir = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_MEM_FAIL);
    return (ARK_MEM_FAIL);
  }

  /* Set default values for rootdir (both directions) */
  for (i = 0; i < nrt; i++) { ark_mem->root_mem->rootdir[i] = 0; }

  /* Set default values for gactive (all active) */
  for (i = 0; i < nrt; i++) { ark_mem->root_mem->gactive[i] = SUNTRUE; }

  ark_mem->lrw += 3 * nrt;
  ark_mem->liw += 3 * nrt;

  return (ARK_SUCCESS);
}